

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testSerializationAPIsWork(void)

{
  __type _Var1;
  ostream *poVar2;
  bool condition_2;
  string buff_str;
  string stream_str;
  bool condition_1;
  bool condition;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  stringstream stream;
  byte_t *packet_content;
  string packet_content_str;
  ostream *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  data_len_t len;
  byte_t *in_stack_fffffffffffffd08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __end;
  undefined8 in_stack_fffffffffffffd30;
  data_len_t len_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __beg;
  byte_t *in_stack_fffffffffffffd38;
  allocator<char> local_239;
  uchar *local_238;
  uchar *local_230;
  string local_228 [32];
  string local_208 [38];
  undefined1 local_1e2;
  undefined1 local_1e1;
  uchar local_1e0 [24];
  stringstream local_1c8 [392];
  undefined8 local_40;
  allocator local_21;
  string local_20 [32];
  
  len_00 = (data_len_t)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  len = (data_len_t)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"example",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  local_40 = std::__cxx11::string::data();
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x107fd8);
  std::__cxx11::string::size();
  local_1e1 = packet::PacketT<packet::DefaultConfig>::serialize
                        (in_stack_fffffffffffffd08,len,in_stack_fffffffffffffcf8);
  if (!(bool)local_1e1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"testSerializationAPIsWork");
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x45);
    std::operator<<(poVar2,
                    "] TEST_ASSERT failed packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), stream)\n"
                   );
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x45,"void testSerializationAPIsWork()");
  }
  std::__cxx11::string::size();
  local_1e2 = packet::PacketT<packet::DefaultConfig>::serialize
                        (in_stack_fffffffffffffd38,len_00,in_stack_fffffffffffffd28);
  if (!(bool)local_1e2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"testSerializationAPIsWork");
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x46);
    std::operator<<(poVar2,
                    "] TEST_ASSERT failed packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), buffer)\n"
                   );
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x46,"void testSerializationAPIsWork()");
  }
  std::__cxx11::stringstream::str();
  __end._M_current = local_1e0;
  local_230 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffcf8);
  local_238 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffcf8);
  __beg._M_current = (uchar *)&local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            (in_stack_fffffffffffffd20,__beg,__end,(allocator<char> *)in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator(&local_239);
  _Var1 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (!_Var1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"testSerializationAPIsWork");
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4a);
    std::operator<<(poVar2,"] TEST_ASSERT failed stream_str == buff_str\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x4a,"void testSerializationAPIsWork()");
  }
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffd10);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void 
testSerializationAPIsWork(void)
{
  const std::string packet_content_str = "example";
  const packet::byte_t* packet_content = reinterpret_cast<const packet::byte_t*>(packet_content_str.data());
  std::stringstream stream;
  std::vector<packet::byte_t> buffer;

  // serialize both apis
  TEST_ASSERT(packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), stream));
  TEST_ASSERT(packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), buffer));

  const std::string stream_str = stream.str();
  const std::string buff_str(buffer.begin(), buffer.end());
  TEST_ASSERT(stream_str == buff_str);
}